

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraSublimeTextGenerator::ComputeIncludes_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  string *config;
  char *expression;
  string *includes_list;
  allocator<char> local_129;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string INCLUDE_DIRECTORIES;
  string local_f0;
  string local_d0;
  string local_b0;
  cmGeneratorExpressionInterpreter genexInterpreter;
  
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = lg->Makefile;
  cmSourceFile::GetLanguage_abi_cxx11_(&local_f0,source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&genexInterpreter,"CMAKE_BUILD_TYPE",(allocator<char> *)&INCLUDE_DIRECTORIES)
  ;
  config = cmMakefile::GetSafeDefinition(this_00,(string *)&genexInterpreter);
  std::__cxx11::string::~string((string *)&genexInterpreter);
  std::__cxx11::string::string((string *)&local_b0,(string *)config);
  std::__cxx11::string::string((string *)&local_d0,(string *)&local_f0);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&genexInterpreter,lg,&local_b0,target,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&INCLUDE_DIRECTORIES,"INCLUDE_DIRECTORIES",&local_129);
  expression = cmSourceFile::GetProperty(source,&INCLUDE_DIRECTORIES);
  if (expression != (char *)0x0) {
    includes_list =
         cmGeneratorExpressionInterpreter::Evaluate
                   (&genexInterpreter,expression,&INCLUDE_DIRECTORIES);
    cmLocalGenerator::AppendIncludeDirectories(lg,&includes,includes_list,source);
  }
  cmLocalGenerator::GetIncludeDirectories(lg,&includes,target,&local_f0,config);
  cmLocalGenerator::GetIncludeFlags
            (__return_storage_ptr__,lg,&includes,target,&local_f0,true,false,config);
  std::__cxx11::string::~string((string *)&INCLUDE_DIRECTORIES);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter(&genexInterpreter);
  std::__cxx11::string::~string((string *)&local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeIncludes(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* target)

{
  std::vector<std::string> includes;
  cmMakefile* makefile = lg->GetMakefile();
  const std::string& language = source->GetLanguage();
  const std::string& config = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmGeneratorExpressionInterpreter genexInterpreter(lg, config, target,
                                                    language);

  // Add include directories for this source file
  const std::string INCLUDE_DIRECTORIES("INCLUDE_DIRECTORIES");
  if (const char* cincludes = source->GetProperty(INCLUDE_DIRECTORIES)) {
    lg->AppendIncludeDirectories(
      includes, genexInterpreter.Evaluate(cincludes, INCLUDE_DIRECTORIES),
      *source);
  }

  // Add include directory flags.
  lg->GetIncludeDirectories(includes, target, language, config);

  std::string includesString =
    lg->GetIncludeFlags(includes, target, language, true, false, config);

  return includesString;
}